

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdas_obj.cpp
# Opt level: O0

uint32_t parseNumber(FileStackNode *where,uint32_t lineNo,char *str,NumberType base)

{
  uint32_t uVar1;
  char *pcStack_30;
  uint32_t res;
  char *endptr;
  char *pcStack_20;
  NumberType base_local;
  char *str_local;
  FileStackNode *pFStack_10;
  uint32_t lineNo_local;
  FileStackNode *where_local;
  
  endptr._4_4_ = base;
  pcStack_20 = str;
  str_local._4_4_ = lineNo;
  pFStack_10 = where;
  if (*str == '\0') {
    fatal(where,lineNo,"Expected number, got empty string");
  }
  uVar1 = readNumber(str,&stack0xffffffffffffffd0,base);
  if (*pcStack_30 != '\0') {
    fatal(pFStack_10,str_local._4_4_,"Expected number, got \"%s\"",pcStack_20);
  }
  return uVar1;
}

Assistant:

static uint32_t parseNumber(struct FileStackNode const *where, uint32_t lineNo, char const *restrict str, enum NumberType base) {
	if (str[0] == '\0')
		fatal(where, lineNo, "Expected number, got empty string");

	char const *endptr;
	uint32_t res = readNumber(str, &endptr, base);

	if (*endptr != '\0')
		fatal(where, lineNo, "Expected number, got \"%s\"", str);
	return res;
}